

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcWallType::~IfcWallType(IfcWallType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x947570;
  *(undefined8 *)&this->field_0x1c0 = 0x947688;
  *(undefined8 *)&this->field_0x88 = 0x947598;
  *(undefined8 *)&this->field_0x98 = 0x9475c0;
  *(undefined8 *)&this->field_0xf0 = 0x9475e8;
  *(undefined8 *)&this->field_0x148 = 0x947610;
  *(undefined8 *)&this->field_0x180 = 0x947638;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x947660;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>).field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x947950;
  *(undefined8 *)&this->field_0x1c0 = 0x947a18;
  *(undefined8 *)&this->field_0x88 = 0x947978;
  *(undefined8 *)&this->field_0x98 = 0x9479a0;
  *(undefined8 *)&this->field_0xf0 = 0x9479c8;
  *(undefined8 *)&this->field_0x148 = 0x9479f0;
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__009476b0);
  operator_delete(this);
  return;
}

Assistant:

IfcWallType() : Object("IfcWallType") {}